

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

bool __thiscall Memory::Recycler::EndMark(Recycler *this)

{
  DOMWrapperTracingEnterFinalPauseCallback p_Var1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  AutoFilterExceptionRegion local_34 [2];
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  
  bVar3 = DoQueueTrackedObject(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xae7,"(!this->DoQueueTrackedObject())","!this->DoQueueTrackedObject()");
    if (!bVar3) goto LAB_0068134d;
    *puVar5 = 0;
  }
  if ((SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>.next !=
      &this->clientTrackedObjectList) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xaea,"(this->clientTrackedObjectList.Empty())",
                       "this->clientTrackedObjectList.Empty()");
    if (!bVar3) {
LAB_0068134d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  AutoFilterExceptionRegion::AutoFilterExceptionRegion(local_34,ExceptionType_All);
  if (this->needExternalWrapperTracing == true) {
    p_Var1 = this->collectionWrapper->wrapperTracingEnterFinalPauseCallback;
    if (p_Var1 != (DOMWrapperTracingEnterFinalPauseCallback)0x0) {
      (*p_Var1)(this->collectionWrapper->wrapperTracingCallbackState);
    }
    FinishWrapperObjectTracing(this);
  }
  (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[5])();
  AutoFilterExceptionRegion::~AutoFilterExceptionRegion(local_34);
  bVar3 = EndMarkCheckOOMRescan(this);
  bVar4 = ProcessObjectBeforeCollectCallbacks(this,false);
  if (bVar4) {
    bVar4 = EndMarkCheckOOMRescan(this);
    bVar3 = bVar3 || bVar4;
  }
  MarkContext::Cleanup(&this->markContext);
  MarkContext::Cleanup(&this->parallelMarkContext1);
  MarkContext::Cleanup(&this->parallelMarkContext2);
  MarkContext::Cleanup(&this->parallelMarkContext3);
  MarkContext::DecommitPages(&this->markContext);
  MarkContext::DecommitPages(&this->parallelMarkContext1);
  MarkContext::DecommitPages(&this->parallelMarkContext2);
  MarkContext::DecommitPages(&this->parallelMarkContext3);
  return bVar3;
}

Assistant:

bool
Recycler::EndMark()
{
#if ENABLE_CONCURRENT_GC
    Assert(!this->DoQueueTrackedObject());
#endif
#if ENABLE_PARTIAL_GC
    Assert(this->clientTrackedObjectList.Empty());
#endif

    {
        // We have finished marking
        AUTO_NO_EXCEPTION_REGION;
        if (this->needExternalWrapperTracing)
        {
            this->collectionWrapper->EndMarkDomWrapperTracingEnterFinalPauseCallback();
            this->FinishWrapperObjectTracing();
        }

        collectionWrapper->EndMarkCallback();
    }

    bool oomRescan = EndMarkCheckOOMRescan();

    if (ProcessObjectBeforeCollectCallbacks())
    {
        // callbacks may trigger additional marking, need to check OOMRescan again
        oomRescan |= EndMarkCheckOOMRescan();
    }

    // GC-CONSIDER: Consider keeping some page around
    GCETW(GC_DECOMMIT_CONCURRENT_COLLECT_PAGE_ALLOCATOR_START, (this));

    // Clean up mark contexts, which will release held free pages
    // Do this for all contexts before we decommit, to make sure all pages are freed
    markContext.Cleanup();
    parallelMarkContext1.Cleanup();
    parallelMarkContext2.Cleanup();
    parallelMarkContext3.Cleanup();

    // Decommit all pages
    markContext.DecommitPages();
    parallelMarkContext1.DecommitPages();
    parallelMarkContext2.DecommitPages();
    parallelMarkContext3.DecommitPages();

    GCETW(GC_DECOMMIT_CONCURRENT_COLLECT_PAGE_ALLOCATOR_STOP, (this));

    return oomRescan;
}